

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_value_constructor_list_Test::TestBody
          (ObjectTest_basic_value_constructor_list_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  _List_base<bool,_std::allocator<bool>_> local_a8;
  AssertionResult gtest_ar_;
  _List_base<jessilib::object,_std::allocator<jessilib::object>_> local_70;
  object test_object__;
  
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_prev =
       local_a8._M_impl._M_node.super__List_node_base._M_next;
  jessilib::object::object<std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            (&test_object__,
             (list<bool,_std::allocator<bool>_> *)
             local_a8._M_impl._M_node.super__List_node_base._M_next);
  std::__cxx11::_List_base<bool,_std::allocator<bool>_>::_M_clear(&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<bool> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x185,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )gtest_ar_._0_8_;
  jessilib::object::
  get<std::__cxx11::list<bool,_std::allocator<bool>_>,_std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            ((list<bool,_std::allocator<bool>_> *)&local_a8,&test_object__,
             (list<bool,_std::allocator<bool>_> *)gtest_ar_._0_8_);
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_prev =
       local_70._M_impl._M_node.super__List_node_base._M_next;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<bool,std::allocator<bool>>,std::__cxx11::list<bool,std::allocator<bool>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<bool> >()","std::list<bool> {}",
             (list<bool,_std::allocator<bool>_> *)&local_a8,
             (list<bool,_std::allocator<bool>_> *)
             local_70._M_impl._M_node.super__List_node_base._M_next);
  std::__cxx11::_List_base<bool,_std::allocator<bool>_>::_M_clear
            ((_List_base<bool,_std::allocator<bool>_> *)&local_70);
  std::__cxx11::_List_base<bool,_std::allocator<bool>_>::_M_clear(&local_a8);
  std::__cxx11::_List_base<bool,_std::allocator<bool>_>::_M_clear
            ((_List_base<bool,_std::allocator<bool>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x185,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            (&test_object__,(list<signed_char,_std::allocator<signed_char>_> *)&local_a8);
  std::__cxx11::_List_base<signed_char,_std::allocator<signed_char>_>::_M_clear
            ((_List_base<signed_char,_std::allocator<signed_char>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<signed char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x186,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_base<bool,_std::allocator<bool>_> *)
                  &(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((list<signed_char,_std::allocator<signed_char>_> *)&local_a8,&test_object__,
             (list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<signed_char,std::allocator<signed_char>>,std::__cxx11::list<signed_char,std::allocator<signed_char>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<signed char> >()",
             "std::list<signed char> {}",
             (list<signed_char,_std::allocator<signed_char>_> *)&local_a8,
             (list<signed_char,_std::allocator<signed_char>_> *)&local_70);
  std::__cxx11::_List_base<signed_char,_std::allocator<signed_char>_>::_M_clear
            ((_List_base<signed_char,_std::allocator<signed_char>_> *)&local_70);
  std::__cxx11::_List_base<signed_char,_std::allocator<signed_char>_>::_M_clear
            ((_List_base<signed_char,_std::allocator<signed_char>_> *)&local_a8);
  std::__cxx11::_List_base<signed_char,_std::allocator<signed_char>_>::_M_clear
            ((_List_base<signed_char,_std::allocator<signed_char>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x186,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  object<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            (&test_object__,(list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<unsigned char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x187,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,&test_object__,
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>,std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<unsigned char> >()",
             "std::list<unsigned char> {}",
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x187,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            (&test_object__,(list<short,_std::allocator<short>_> *)&local_a8);
  std::__cxx11::_List_base<short,_std::allocator<short>_>::_M_clear
            ((_List_base<short,_std::allocator<short>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<short> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x188,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<short,_std::allocator<short>_>,_std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            ((list<short,_std::allocator<short>_> *)&local_a8,&test_object__,
             (list<short,_std::allocator<short>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<short,std::allocator<short>>,std::__cxx11::list<short,std::allocator<short>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<short> >()","std::list<short> {}",
             (list<short,_std::allocator<short>_> *)&local_a8,
             (list<short,_std::allocator<short>_> *)&local_70);
  std::__cxx11::_List_base<short,_std::allocator<short>_>::_M_clear
            ((_List_base<short,_std::allocator<short>_> *)&local_70);
  std::__cxx11::_List_base<short,_std::allocator<short>_>::_M_clear
            ((_List_base<short,_std::allocator<short>_> *)&local_a8);
  std::__cxx11::_List_base<short,_std::allocator<short>_>::_M_clear
            ((_List_base<short,_std::allocator<short>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x188,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            (&test_object__,(list<int,_std::allocator<int>_> *)&local_a8);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<int> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x189,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<int,_std::allocator<int>_>,_std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            ((list<int,_std::allocator<int>_> *)&local_a8,&test_object__,
             (list<int,_std::allocator<int>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<int,std::allocator<int>>,std::__cxx11::list<int,std::allocator<int>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<int> >()","std::list<int> {}",
             (list<int,_std::allocator<int>_> *)&local_a8,
             (list<int,_std::allocator<int>_> *)&local_70);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&local_70);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&local_a8);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x189,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            (&test_object__,(list<long,_std::allocator<long>_> *)&local_a8);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18a,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((list<long,_std::allocator<long>_> *)&local_a8,&test_object__,
             (list<long,_std::allocator<long>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long,std::allocator<long>>,std::__cxx11::list<long,std::allocator<long>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<long> >()","std::list<long> {}",
             (list<long,_std::allocator<long>_> *)&local_a8,
             (list<long,_std::allocator<long>_> *)&local_70);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&local_70);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&local_a8);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            (&test_object__,(list<long_long,_std::allocator<long_long>_> *)&local_a8);
  std::__cxx11::_List_base<long_long,_std::allocator<long_long>_>::_M_clear
            ((_List_base<long_long,_std::allocator<long_long>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<long long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18b,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((list<long_long,_std::allocator<long_long>_> *)&local_a8,&test_object__,
             (list<long_long,_std::allocator<long_long>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long_long,std::allocator<long_long>>,std::__cxx11::list<long_long,std::allocator<long_long>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<long long> >()",
             "std::list<long long> {}",(list<long_long,_std::allocator<long_long>_> *)&local_a8,
             (list<long_long,_std::allocator<long_long>_> *)&local_70);
  std::__cxx11::_List_base<long_long,_std::allocator<long_long>_>::_M_clear
            ((_List_base<long_long,_std::allocator<long_long>_> *)&local_70);
  std::__cxx11::_List_base<long_long,_std::allocator<long_long>_>::_M_clear
            ((_List_base<long_long,_std::allocator<long_long>_> *)&local_a8);
  std::__cxx11::_List_base<long_long,_std::allocator<long_long>_>::_M_clear
            ((_List_base<long_long,_std::allocator<long_long>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            (&test_object__,(list<long,_std::allocator<long>_> *)&local_a8);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<intmax_t> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18c,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((list<long,_std::allocator<long>_> *)&local_a8,&test_object__,
             (list<long,_std::allocator<long>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long,std::allocator<long>>,std::__cxx11::list<long,std::allocator<long>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<intmax_t> >()",
             "std::list<intmax_t> {}",(list<long,_std::allocator<long>_> *)&local_a8,
             (list<long,_std::allocator<long>_> *)&local_70);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&local_70);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&local_a8);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            ((_List_base<long,_std::allocator<long>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            (&test_object__,(list<float,_std::allocator<float>_> *)&local_a8);
  std::__cxx11::_List_base<float,_std::allocator<float>_>::_M_clear
            ((_List_base<float,_std::allocator<float>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<float> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18d,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<float,_std::allocator<float>_>,_std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            ((list<float,_std::allocator<float>_> *)&local_a8,&test_object__,
             (list<float,_std::allocator<float>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<float,std::allocator<float>>,std::__cxx11::list<float,std::allocator<float>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<float> >()","std::list<float> {}",
             (list<float,_std::allocator<float>_> *)&local_a8,
             (list<float,_std::allocator<float>_> *)&local_70);
  std::__cxx11::_List_base<float,_std::allocator<float>_>::_M_clear
            ((_List_base<float,_std::allocator<float>_> *)&local_70);
  std::__cxx11::_List_base<float,_std::allocator<float>_>::_M_clear
            ((_List_base<float,_std::allocator<float>_> *)&local_a8);
  std::__cxx11::_List_base<float,_std::allocator<float>_>::_M_clear
            ((_List_base<float,_std::allocator<float>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            (&test_object__,(list<double,_std::allocator<double>_> *)&local_a8);
  std::__cxx11::_List_base<double,_std::allocator<double>_>::_M_clear
            ((_List_base<double,_std::allocator<double>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18e,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<double,_std::allocator<double>_>,_std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            ((list<double,_std::allocator<double>_> *)&local_a8,&test_object__,
             (list<double,_std::allocator<double>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<double,std::allocator<double>>,std::__cxx11::list<double,std::allocator<double>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<double> >()","std::list<double> {}"
             ,(list<double,_std::allocator<double>_> *)&local_a8,
             (list<double,_std::allocator<double>_> *)&local_70);
  std::__cxx11::_List_base<double,_std::allocator<double>_>::_M_clear
            ((_List_base<double,_std::allocator<double>_> *)&local_70);
  std::__cxx11::_List_base<double,_std::allocator<double>_>::_M_clear
            ((_List_base<double,_std::allocator<double>_> *)&local_a8);
  std::__cxx11::_List_base<double,_std::allocator<double>_>::_M_clear
            ((_List_base<double,_std::allocator<double>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x18e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::object<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            (&test_object__,(list<long_double,_std::allocator<long_double>_> *)&local_a8);
  std::__cxx11::_List_base<long_double,_std::allocator<long_double>_>::_M_clear
            ((_List_base<long_double,_std::allocator<long_double>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<long double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,399,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((list<long_double,_std::allocator<long_double>_> *)&local_a8,&test_object__,
             (list<long_double,_std::allocator<long_double>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<long_double,std::allocator<long_double>>,std::__cxx11::list<long_double,std::allocator<long_double>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<long double> >()",
             "std::list<long double> {}",
             (list<long_double,_std::allocator<long_double>_> *)&local_a8,
             (list<long_double,_std::allocator<long_double>_> *)&local_70);
  std::__cxx11::_List_base<long_double,_std::allocator<long_double>_>::_M_clear
            ((_List_base<long_double,_std::allocator<long_double>_> *)&local_70);
  std::__cxx11::_List_base<long_double,_std::allocator<long_double>_>::_M_clear
            ((_List_base<long_double,_std::allocator<long_double>_> *)&local_a8);
  std::__cxx11::_List_base<long_double,_std::allocator<long_double>_>::_M_clear
            ((_List_base<long_double,_std::allocator<long_double>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,399,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  object<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            (&test_object__,
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<std::u8string> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,400,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8,&test_object__,
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>,std::__cxx11::list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<std::u8string> >()",
             "std::list<std::u8string> {}",
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8,
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_70);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_70);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,400,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  object<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            (&test_object__,(list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       test_object__.m_value.
       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
       .
       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       .
       super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       ._M_index == '\x06';
  if (test_object__.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index != '\x06') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a8,&gtest_ar_.success_,
               "test_object__ .has< std::list<object> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x191,(char *)local_a8._M_impl._M_node.super__List_node_base._M_next);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_70._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = &gtest_ar_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&gtest_ar_;
  jessilib::object::
  get<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8,&test_object__,
             (list<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar_);
  local_70._M_impl._M_node._M_size = 0;
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
  testing::internal::
  CmpHelperEQ<std::__cxx11::list<jessilib::object,std::allocator<jessilib::object>>,std::__cxx11::list<jessilib::object,std::allocator<jessilib::object>>>
            ((internal *)&gtest_ar,"test_object__.get< std::list<object> >()","std::list<object> {}"
             ,(list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8,
             (list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_70);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear(&local_70)
  ;
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x191,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8._M_impl._M_node.super__List_node_base._M_next !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&test_object__);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_list) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<object>);
}